

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_util.h
# Opt level: O0

void cpsm::
     str_cat_impl<char_const*,char_const*,boost::basic_string_ref<char,std::char_traits<char>>,char_const*>
               (stringstream *ss,char **x,char *args,
               basic_string_ref<char,_std::char_traits<char>_> args_1,char *args_2)

{
  basic_string_ref<char,_std::char_traits<char>_> args_00;
  stringstream *in_RCX;
  undefined8 *in_RSI;
  long in_RDI;
  char *in_R8;
  size_t in_R9;
  char **in_stack_ffffffffffffffb8;
  
  std::operator<<((ostream *)(in_RDI + 0x10),(char *)*in_RSI);
  args_00.len_ = in_R9;
  args_00.ptr_ = in_R8;
  str_cat_impl<char_const*,boost::basic_string_ref<char,std::char_traits<char>>,char_const*>
            (in_RCX,in_stack_ffffffffffffffb8,args_00,(char *)0x13429a);
  return;
}

Assistant:

void str_cat_impl(std::stringstream& ss, T const& x, Args... args) {
  ss << x;
  str_cat_impl(ss, args...);
}